

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

QPointF __thiscall QScroller::pixelPerMeter(QScroller *this)

{
  undefined1 auVar1 [16];
  QPointF QVar2;
  int iVar3;
  long lVar4;
  QGraphicsScene *this_00;
  long lVar5;
  QPointF *pQVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QArrayData *pQVar10;
  qsizetype qVar11;
  undefined1 *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  QPointF QVar15;
  QGraphicsView **in_XMM1_Qa;
  QTransform tr;
  QTransform viewtr;
  QList<QGraphicsView_*> local_d8;
  QPointF local_b8 [5];
  QTransform local_68;
  long local_18;
  
  bVar9 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = &this->d_ptr->pixelPerMeter;
  QVar15 = *pQVar6;
  QVar2 = *pQVar6;
  lVar4 = QMetaObject::cast((QObject *)&QGraphicsObject::staticMetaObject);
  if (lVar4 != 0) {
    pqVar7 = (qreal *)&DAT_006f78b8;
    pQVar8 = &local_68;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    pqVar7 = (qreal *)&DAT_006f7dc8;
    pQVar8 = &local_68;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    local_68._72_2_ = 0xa800;
    this_00 = (QGraphicsScene *)QGraphicsItem::scene((QGraphicsItem *)(lVar4 + 0x10));
    if (this_00 != (QGraphicsScene *)0x0) {
      local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views(&local_d8,this_00);
      if ((undefined1 *)local_d8.d.size != (undefined1 *)0x0) {
        QGraphicsView::viewportTransform((QTransform *)local_b8,(QGraphicsView *)*local_d8.d.ptr);
        pQVar6 = local_b8;
        pQVar8 = &local_68;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          pQVar8->m_matrix[0][0] = (*(qreal (*) [3])&pQVar6->xp)[0];
          pQVar6 = (QPointF *)&pQVar6[-(ulong)bVar9].yp;
          pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        local_68._72_2_ = local_b8[4].yp._0_2_;
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    pqVar7 = (qreal *)&DAT_006f78b8;
    pQVar6 = local_b8;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (*(qreal (*) [3])&pQVar6->xp)[0] = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar6 = (QPointF *)&pQVar6[-(ulong)bVar9].yp;
    }
    QGraphicsItem::deviceTransform((QTransform *)local_b8,(QGraphicsItem *)(lVar4 + 0x10),&local_68)
    ;
    iVar3 = QTransform::type();
    if (1 < iVar3) {
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (QGraphicsView **)0x0;
      pQVar10 = (QArrayData *)QTransform::map(local_b8);
      local_d8.d.d = (Data *)0x3ff0000000000000;
      local_d8.d.ptr = (QGraphicsView **)0x0;
      qVar11 = QTransform::map(local_b8);
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (QGraphicsView **)0x3ff0000000000000;
      puVar12 = (undefined1 *)QTransform::map(local_b8);
      local_d8.d.d = (Data *)pQVar10;
      local_d8.d.size = qVar11;
      uVar13 = QLineF::length();
      local_d8.d.d = (Data *)pQVar10;
      local_d8.d.ptr = in_XMM1_Qa;
      local_d8.d.size = (qsizetype)puVar12;
      uVar14 = QLineF::length();
      auVar1._8_8_ = uVar14;
      auVar1._0_8_ = uVar13;
      QVar15 = (QPointF)divpd((undefined1  [16])QVar2,auVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return QVar15;
}

Assistant:

QPointF QScroller::pixelPerMeter() const
{
    Q_D(const QScroller);
    QPointF ppm = d->pixelPerMeter;

#if QT_CONFIG(graphicsview)
    if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->target)) {
        QTransform viewtr;
        //TODO: the first view isn't really correct - maybe use an additional field in the prepare event?
        if (const auto *scene = go->scene()) {
            const auto views = scene->views();
            if (!views.isEmpty())
                viewtr = views.first()->viewportTransform();
        }
        QTransform tr = go->deviceTransform(viewtr);
        if (tr.isScaling()) {
            QPointF p0 = tr.map(QPointF(0, 0));
            QPointF px = tr.map(QPointF(1, 0));
            QPointF py = tr.map(QPointF(0, 1));
            ppm.rx() /= QLineF(p0, px).length();
            ppm.ry() /= QLineF(p0, py).length();
        }
    }
#endif // QT_CONFIG(graphicsview)
    return ppm;
}